

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O2

void __thiscall cmSourceGroup::cmSourceGroup(cmSourceGroup *this,cmSourceGroup *r)

{
  _Rb_tree_header *p_Var1;
  cmSourceGroupInternals *this_00;
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->FullName)._M_dataplus._M_p = (pointer)&(this->FullName).field_2;
  (this->FullName)._M_string_length = 0;
  (this->FullName).field_2._M_local_buf[0] = '\0';
  (this->GroupRegex).program = (char *)0x0;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->GroupFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->FullName);
  cmsys::RegularExpression::operator=(&this->GroupRegex,&r->GroupRegex);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->GroupFiles)._M_t,&(r->GroupFiles)._M_t);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::operator=
            (&this->SourceFiles,&r->SourceFiles);
  this_00 = (cmSourceGroupInternals *)operator_new(0x18);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)this_00,
             &r->Internal->GroupChildren);
  this->Internal = this_00;
  return;
}

Assistant:

cmSourceGroup::cmSourceGroup(cmSourceGroup const& r)
{
  this->Name = r.Name;
  this->FullName = r.FullName;
  this->GroupRegex = r.GroupRegex;
  this->GroupFiles = r.GroupFiles;
  this->SourceFiles = r.SourceFiles;
  this->Internal = new cmSourceGroupInternals(*r.Internal);
}